

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O2

CordRepFlat * __thiscall
absl::cord_internal::CordRepFlat::Create(CordRepFlat *this,string_view data,size_t extra)

{
  CordRepFlat *pCVar1;
  char *pcVar2;
  
  if (this < (CordRepFlat *)0xff4) {
    pcVar2 = (char *)0xff3;
    if (data._M_str < (char *)0xff3) {
      pcVar2 = data._M_str;
    }
    pCVar1 = NewImpl<4096ul>((size_t)(pcVar2 + (long)this));
    memcpy((pCVar1->super_CordRep).storage,(void *)data._M_len,(size_t)this);
    (pCVar1->super_CordRep).length = (size_t)this;
    return pCVar1;
  }
  __assert_fail("data.size() <= kMaxFlatLength",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_flat.h"
                ,0xa2,
                "static CordRepFlat *absl::cord_internal::CordRepFlat::Create(absl::string_view, size_t)"
               );
}

Assistant:

static CordRepFlat* Create(absl::string_view data, size_t extra = 0) {
    assert(data.size() <= kMaxFlatLength);
    CordRepFlat* flat = New(data.size() + (std::min)(extra, kMaxFlatLength));
    memcpy(flat->Data(), data.data(), data.size());
    flat->length = data.size();
    return flat;
  }